

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O2

void MD5Update(MD5_CTX *context,uchar *input,uint inputlen)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar1 = context->count[0];
  uVar2 = uVar1 >> 3 & 0x3f;
  uVar4 = 0x40 - uVar2;
  context->count[0] = inputlen * 8 + uVar1;
  context->count[1] = context->count[1] + (inputlen >> 0x1d) + (uint)CARRY4(inputlen * 8,uVar1);
  if (inputlen < uVar4) {
    uVar3 = (ulong)uVar2;
    uVar4 = 0;
  }
  else {
    memcpy(context->buffer + uVar2,input,(ulong)uVar4);
    MD5Transform(context->state,context->buffer);
    while (uVar4 + 0x40 <= inputlen) {
      MD5Transform(context->state,input + uVar4);
      uVar4 = uVar4 + 0x40;
    }
    uVar3 = 0;
  }
  memcpy(context->buffer + uVar3,input + uVar4,(ulong)(inputlen - uVar4));
  return;
}

Assistant:

void MD5Update(MD5_CTX *context, unsigned char *input, unsigned int inputlen)
{
    unsigned int i = 0;
    unsigned int index = 0;
    unsigned int partlen = 0;

    index = (context->count[0] >> 3) & 0x3F;
    partlen = 64 - index;
    context->count[0] += inputlen << 3;

    if(context->count[0] < (inputlen << 3))
        context->count[1]++;
    context->count[1] += inputlen >> 29;

    if(inputlen >= partlen)
    {
        memcpy(&context->buffer[index], input,partlen);
        MD5Transform(context->state, context->buffer);

        for(i = partlen; i+64 <= inputlen; i+=64)
            MD5Transform(context->state, &input[i]);

        index = 0;        
    }  
    else
    {
        i = 0;
    }
    memcpy(&context->buffer[index], &input[i], inputlen-i);
}